

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase283::run(TestCase283 *this)

{
  PromiseArena *pPVar1;
  PromiseBase node;
  undefined8 uVar2;
  undefined8 uVar3;
  SegmentBuilder *pSVar4;
  CapTableBuilder *pCVar5;
  RequestHook *pRVar6;
  PromiseArenaMember *node_00;
  long *plVar7;
  OwnPromiseNode OVar8;
  PromiseFulfiller<void> *pPVar9;
  ClientHook *pCVar10;
  WeakFulfiller<void> *params;
  void *pvVar11;
  long *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  PromiseNode *ptrCopy;
  TransformPromiseNodeBase *pTVar12;
  int in_R8D;
  Own<capnp::ClientHook,_std::nullptr_t> OVar13;
  bool returned;
  bool destroyed;
  Promise<void> destructionPromise;
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  request;
  PromiseFulfillerPair<void> paf;
  Client client;
  WaitScope waitScope;
  int handleCount;
  int callCount;
  EventLoop loop;
  char local_202;
  undefined1 local_201;
  PromiseBase local_200;
  undefined1 local_1f8 [48];
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  local_1c8;
  PromiseArenaMember *local_188;
  long *local_180;
  OwnPromiseNode local_178;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> local_170;
  pointer_____offset_0x10___ *local_160;
  Client local_158;
  undefined1 local_148 [16];
  long *local_138;
  EventLoop *local_130;
  byte local_128 [8];
  long local_120;
  byte abStack_118 [8];
  OwnPromiseNode local_110;
  int local_108 [2];
  char *local_100;
  undefined *puStack_f8;
  byte local_f0 [8];
  char *local_e8;
  undefined *puStack_e0;
  byte local_d8 [8];
  char *local_d0;
  undefined *puStack_c8;
  byte local_c0 [8];
  Maybe<capnp::MessageSize> local_b8;
  EventLoop local_a0;
  
  kj::EventLoop::EventLoop(&local_a0);
  local_128[0] = 0xff;
  local_128[1] = 0xff;
  local_128[2] = 0xff;
  local_128[3] = 0xff;
  local_120 = 0;
  abStack_118[0] = '\0';
  abStack_118[1] = '\0';
  abStack_118[2] = '\0';
  abStack_118[3] = '\0';
  abStack_118[4] = '\0';
  abStack_118[5] = '\0';
  abStack_118[6] = '\0';
  abStack_118[7] = '\0';
  local_130 = &local_a0;
  kj::EventLoop::enterScope(&local_a0);
  params = (WeakFulfiller<void> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_006b66f0;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006b6728;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)(local_1f8 + 0x30),params);
  local_178.ptr = (PromiseNode *)local_1c8.super_Builder._builder.segment;
  local_201 = 0;
  pPVar1 = *(PromiseArena **)((long)local_1c8.super_Builder._builder.segment + 8);
  local_170.disposer = &(params->super_WeakFulfillerBase).super_Disposer;
  local_170.ptr = (PromiseFulfiller<void> *)params;
  if (pPVar1 == (PromiseArena *)0x0 ||
      (ulong)((long)local_1c8.super_Builder._builder.segment - (long)pPVar1) < 0x28) {
    pvVar11 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,&local_178,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:291:46)>
               ::anon_class_8_1_8c041cb9_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_006b52d8;
    *(undefined1 **)((long)pvVar11 + 0x3f8) = &local_201;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    *(PromiseArena **)((long)local_1c8.super_Builder._builder.segment + 8) = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)
              &((PromiseArenaMember *)((long)local_1c8.super_Builder._builder.segment + -0x30))->
               arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,&local_178,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:291:46)>
               ::anon_class_8_1_8c041cb9_for_func::operator());
    ((PromiseArenaMember *)((long)local_1c8.super_Builder._builder.segment + -0x30))->arena =
         (PromiseArena *)&PTR_destroy_006b52d8;
    ((PromiseArenaMember *)((long)local_1c8.super_Builder._builder.segment + -0x10))->arena =
         (PromiseArena *)&local_201;
    ((PromiseArenaMember *)((long)local_1c8.super_Builder._builder.segment + -0x20))->
    _vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_1c8.super_Builder._builder.segment = (SegmentBuilder *)0x4d61c0;
  local_1c8.super_Builder._builder.capTable = (CapTableBuilder *)&DAT_004d6248;
  local_1c8.super_Builder._builder.data = (void *)0x1d00000123;
  local_1f8._0_8_ = pTVar12;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_200,(OwnPromiseNode *)local_1f8,
             (SourceLocation *)(local_1f8 + 0x30));
  uVar2 = local_1f8._0_8_;
  if ((TransformPromiseNodeBase *)local_1f8._0_8_ != (TransformPromiseNodeBase *)0x0) {
    local_1f8._0_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  local_108[1] = 0;
  local_108[0] = 0;
  kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>((kj *)local_1f8,local_108 + 1,local_108);
  local_1c8.super_Builder._builder.segment = (SegmentBuilder *)local_1f8._0_8_;
  local_1c8.super_Builder._builder.capTable = (CapTableBuilder *)(local_1f8._8_8_ + 0x30);
  if ((Server *)local_1f8._8_8_ == (Server *)0x0) {
    local_1c8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  }
  local_1f8._8_8_ = (Server *)0x0;
  OVar13 = Capability::Client::makeLocalClient
                     (&local_158,
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)(local_1f8 + 0x30));
  pCVar5 = local_1c8.super_Builder._builder.capTable;
  if ((Server *)local_1c8.super_Builder._builder.capTable != (Server *)0x0) {
    local_1c8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (**(((PromiseNode *)&(local_1c8.super_Builder._builder.segment)->super_SegmentReader)->
       super_PromiseArenaMember)._vptr_PromiseArenaMember)
              (local_1c8.super_Builder._builder.segment,
               (_func_int *)
               ((long)&pCVar5->super_CapTableReader +
               (long)(pCVar5->super_CapTableReader)._vptr_CapTableReader[-2]),OVar13.ptr);
  }
  uVar2 = local_1f8._8_8_;
  local_160 = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  if ((Server *)local_1f8._8_8_ != (Server *)0x0) {
    local_1f8._8_8_ = (Server *)0x0;
    (**((PromiseArenaMember *)&((PromiseArenaMember *)local_1f8._0_8_)->_vptr_PromiseArenaMember)->
       _vptr_PromiseArenaMember)
              (local_1f8._0_8_,
               (_func_int *)((long)(_func_int ***)uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
  }
  local_202 = '\0';
  local_b8.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::expectCancelRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
              *)(local_1f8 + 0x30),(Client *)&local_160,&local_b8);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
            ((kj *)&local_188,&local_170);
  __n = local_180;
  local_1f8._0_8_ = local_188;
  local_1f8._8_8_ = (long)local_180 + 0x48;
  if (local_180 == (long *)0x0) {
    local_1f8._8_8_ = (Server *)0x0;
  }
  local_180 = (long *)0x0;
  OVar13 = Capability::Client::makeLocalClient
                     ((Client *)(local_148 + 8),
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)local_1f8);
  uVar2 = local_1f8._8_8_;
  if ((Server *)local_1f8._8_8_ != (Server *)0x0) {
    local_1f8._8_8_ = (Server *)0x0;
    (**((PromiseArenaMember *)local_1f8._0_8_)->_vptr_PromiseArenaMember)
              (local_1f8._0_8_,
               (_func_int *)((long)(_func_int ***)uVar2 + (long)(*(_func_int ***)uVar2)[-2]),
               OVar13.ptr);
  }
  local_148._0_8_ = &Capability::Client::typeinfo;
  local_1f8._0_8_ = local_1c8.super_Builder._builder.segment;
  local_1f8._8_8_ = local_1c8.super_Builder._builder.capTable;
  local_1f8._16_8_ = local_1c8.super_Builder._builder.pointers;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_1f8,(Own<capnp::ClientHook,_std::nullptr_t> *)(local_148 + 8));
  plVar7 = local_138;
  pvVar11 = extraout_RDX;
  if (local_138 != (long *)0x0) {
    local_138 = (long *)0x0;
    (*(code *)**(undefined8 **)local_148._8_8_)
              (local_148._8_8_,(long)plVar7 + *(long *)(*plVar7 + -0x10));
    pvVar11 = extraout_RDX_00;
  }
  plVar7 = local_180;
  if (local_180 != (long *)0x0) {
    local_180 = (long *)0x0;
    (**local_188->_vptr_PromiseArenaMember)(local_188,(long)plVar7 + *(long *)(*plVar7 + -0x10));
    pvVar11 = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
          *)local_1f8,(int)local_1f8 + 0x30,pvVar11,(size_t)__n,in_R8D);
  uVar2 = local_1f8._0_8_;
  pPVar1 = ((PromiseArenaMember *)local_1f8._0_8_)->arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_1f8._0_8_ - (long)pPVar1) < 0x28) {
    pvVar11 = operator_new(0x400);
    pTVar12 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_1f8,
               kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:305:9)>
               ::anon_class_8_1_d59fe34d_for_func::operator());
    *(undefined ***)((long)pvVar11 + 0x3d8) = &PTR_destroy_006b5330;
    *(char **)((long)pvVar11 + 0x3f8) = &local_202;
    *(void **)((long)pvVar11 + 0x3e0) = pvVar11;
  }
  else {
    ((PromiseArenaMember *)local_1f8._0_8_)->arena = (PromiseArena *)0x0;
    pTVar12 = (TransformPromiseNodeBase *)((OwnPromiseNode *)(local_1f8._0_8_ + -0x30) + 1);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar12,(OwnPromiseNode *)local_1f8,
               kj::_::
               SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:305:9)>
               ::anon_class_8_1_d59fe34d_for_func::operator());
    ((OwnPromiseNode *)(uVar2 + -0x30))[1] = (OwnPromiseNode)&PTR_destroy_006b5330;
    ((OwnPromiseNode *)(uVar2 + -0x10))[1] = (OwnPromiseNode)&local_202;
    (((TransformPromiseNodeBase *)(uVar2 + -0x20))->super_PromiseNode).super_PromiseArenaMember.
    _vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_148._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  local_148._8_8_ = &DAT_004d6248;
  local_138 = (long *)0xf00000130;
  local_110.ptr = &pTVar12->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_188,&local_110,(SourceLocation *)local_148);
  OVar8.ptr = local_110.ptr;
  node_00 = local_188;
  local_188 = (PromiseArenaMember *)0x0;
  if ((TransformPromiseNodeBase *)local_110.ptr != (TransformPromiseNodeBase *)0x0) {
    local_110.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar8.ptr)->super_PromiseArenaMember);
  }
  uVar3 = local_1f8._32_8_;
  uVar2 = local_1f8._24_8_;
  if ((WirePointer *)local_1f8._24_8_ != (WirePointer *)0x0) {
    local_1f8._24_8_ = (WirePointer *)0x0;
    local_1f8._32_4_ = 0;
    local_1f8._36_2_ = 0;
    local_1f8._38_2_ = 0;
    (***(_func_int ***)local_1f8._40_8_)(local_1f8._40_8_,uVar2,8,uVar3,uVar3,0);
  }
  uVar2 = local_1f8._16_8_;
  if ((WirePointer *)local_1f8._16_8_ != (WirePointer *)0x0) {
    local_1f8._16_8_ = (WirePointer *)0x0;
    (***(_func_int ***)local_1f8._8_8_)
              (local_1f8._8_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar2)->value +
               *(long *)((long)*(WirePointer *)uVar2 + -0x10));
  }
  uVar2 = local_1f8._0_8_;
  if ((TransformPromiseNodeBase *)local_1f8._0_8_ != (TransformPromiseNodeBase *)0x0) {
    local_1f8._0_8_ = (TransformPromiseNodeBase *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  pRVar6 = local_1c8.hook.ptr;
  if (local_1c8.hook.ptr != (RequestHook *)0x0) {
    local_1c8.hook.ptr = (RequestHook *)0x0;
    (*(code *)*(local_1c8.hook.disposer)->_vptr_Disposer)
              (local_1c8.hook.disposer,(long)pRVar6 + *(long *)(*(long *)pRVar6 + -0x10));
  }
  kj::yield();
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_c8 = &DAT_004d6248;
  local_c0[0] = '5';
  local_c0[1] = '\x01';
  local_c0[2] = '\0';
  local_c0[3] = '\0';
  local_c0[4] = '\x03';
  local_c0[5] = '\0';
  local_c0[6] = '\0';
  local_c0[7] = '\0';
  kj::Promise<void>::wait((Promise<void> *)(local_1f8 + 0x30),&local_130);
  pSVar4 = local_1c8.super_Builder._builder.segment;
  if (local_1c8.super_Builder._builder.segment != (SegmentBuilder *)0x0) {
    local_1c8.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar4);
  }
  kj::yield();
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_e0 = &DAT_004d6248;
  local_d8[0] = '6';
  local_d8[1] = '\x01';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8[4] = '\x03';
  local_d8[5] = '\0';
  local_d8[6] = '\0';
  local_d8[7] = '\0';
  kj::Promise<void>::wait((Promise<void> *)(local_1f8 + 0x30),&local_130);
  pSVar4 = local_1c8.super_Builder._builder.segment;
  if (local_1c8.super_Builder._builder.segment != (SegmentBuilder *)0x0) {
    local_1c8.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar4);
  }
  local_1c8.super_Builder._builder.segment =
       (SegmentBuilder *)(CONCAT71(local_1c8.super_Builder._builder.segment._1_7_,local_201) ^ 1);
  if ((local_201 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[30],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x139,ERROR,"\"failed: expected \" \"!(destroyed)\", _kjCondition",
               (char (*) [30])"failed: expected !(destroyed)",
               (DebugExpression<bool> *)(local_1f8 + 0x30));
  }
  local_1c8.super_Builder._builder.segment =
       (SegmentBuilder *)(CONCAT71(local_1c8.super_Builder._builder.segment._1_7_,local_202) ^ 1);
  if ((local_202 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x13a,ERROR,"\"failed: expected \" \"!(returned)\", _kjCondition",
               (char (*) [29])"failed: expected !(returned)",
               (DebugExpression<bool> *)(local_1f8 + 0x30));
  }
  if (node_00 != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node_00);
  }
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_f8 = &DAT_004d6248;
  local_f0[0] = '=';
  local_f0[1] = '\x01';
  local_f0[2] = '\0';
  local_f0[3] = '\0';
  local_f0[4] = '\x03';
  local_f0[5] = '\0';
  local_f0[6] = '\0';
  local_f0[7] = '\0';
  kj::Promise<void>::wait((Promise<void> *)&local_200,&local_130);
  local_1c8.super_Builder._builder.segment = (SegmentBuilder *)&local_201;
  if (kj::_::Debug::minSeverity < 3 && local_201 == 0) {
    kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x13f,ERROR,"\"failed: expected \" \"destroyed\", _kjCondition",
               (char (*) [27])"failed: expected destroyed",
               (DebugExpression<bool_&> *)(local_1f8 + 0x30));
  }
  local_1c8.super_Builder._builder.segment =
       (SegmentBuilder *)(CONCAT71(local_1c8.super_Builder._builder.segment._1_7_,local_202) ^ 1);
  if ((local_202 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x140,ERROR,"\"failed: expected \" \"!(returned)\", _kjCondition",
               (char (*) [29])"failed: expected !(returned)",
               (DebugExpression<bool> *)(local_1f8 + 0x30));
  }
  pCVar10 = local_158.hook.ptr;
  if (local_158.hook.ptr != (ClientHook *)0x0) {
    local_158.hook.ptr = (ClientHook *)0x0;
    (**(local_158.hook.disposer)->_vptr_Disposer)
              (local_158.hook.disposer,
               (_func_int *)((long)&pCVar10->_vptr_ClientHook + (long)pCVar10->_vptr_ClientHook[-2])
              );
  }
  node.node.ptr = local_200.node.ptr;
  if (local_200.node.ptr != (PromiseNode *)0x0) {
    local_200.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
  }
  pPVar9 = local_170.ptr;
  if ((WeakFulfiller<void> *)local_170.ptr != (WeakFulfiller<void> *)0x0) {
    local_170.ptr = (PromiseFulfiller<void> *)0x0;
    (**((Disposer *)&(local_170.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_170.disposer,
               (_func_int *)
               ((long)&(((PromiseFulfiller<void> *)&pPVar9->super_PromiseRejector)->
                       super_PromiseRejector)._vptr_PromiseRejector +
               (long)(((PromiseFulfiller<void> *)&pPVar9->super_PromiseRejector)->
                     super_PromiseRejector)._vptr_PromiseRejector[-2]));
  }
  OVar8.ptr = local_178.ptr;
  if (&(local_178.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_178.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar8.ptr)->super_PromiseArenaMember);
  }
  if (local_120 == 0) {
    kj::EventLoop::leaveScope(local_130);
  }
  kj::EventLoop::~EventLoop(&local_a0);
  return;
}

Assistant:

TEST(Capability, AsyncCancelation) {
  // Tests cancellation.

  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  int callCount = 0;
  int handleCount = 0;

  test::TestMoreStuff::Client client(kj::heap<TestMoreStuffImpl>(callCount, handleCount));

  kj::Promise<void> promise = nullptr;

  bool returned = false;
  {
    auto request = client.expectCancelRequest();
    request.setCap(test::TestInterface::Client(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller))));
    promise = request.send().then(
        [&](Response<test::TestMoreStuff::ExpectCancelResults>&& response) {
      returned = true;
    }).eagerlyEvaluate(nullptr);
  }
  kj::yield().wait(waitScope);
  kj::yield().wait(waitScope);

  // We can detect that the method was canceled because it will drop the cap.
  EXPECT_FALSE(destroyed);
  EXPECT_FALSE(returned);

  promise = nullptr;  // request cancellation
  destructionPromise.wait(waitScope);

  EXPECT_TRUE(destroyed);
  EXPECT_FALSE(returned);
}